

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68010_movec(m68k_info *info)

{
  uint uVar1;
  uint uVar2;
  cs_m68k *pcVar3;
  int iVar4;
  long in_RDI;
  cs_m68k_op *op1;
  cs_m68k_op *op0;
  cs_m68k *ext;
  m68k_reg reg;
  uint extension;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined8 in_stack_ffffffffffffffd8;
  m68k_info *in_stack_ffffffffffffffe0;
  float local_10;
  
  if ((*(uint *)(in_RDI + 0x28) & 0x1e) == 0) {
    d68000_invalid((m68k_info *)0x398993);
  }
  else {
    uVar1 = read_imm_16((m68k_info *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    local_10 = 0.0;
    pcVar3 = build_init_op(in_stack_ffffffffffffffe0,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20)
                           ,(int)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
    uVar2 = uVar1 & 0xfff;
    if (uVar2 == 0) {
      local_10 = 3.92364e-44;
    }
    else if (uVar2 == 1) {
      local_10 = 4.06377e-44;
    }
    else if (uVar2 == 2) {
      local_10 = 4.48416e-44;
    }
    else if (uVar2 == 3) {
      local_10 = 5.04467e-44;
    }
    else if (uVar2 == 4) {
      local_10 = 5.1848e-44;
    }
    else if (uVar2 == 5) {
      local_10 = 5.32493e-44;
    }
    else if (uVar2 == 6) {
      local_10 = 5.46506e-44;
    }
    else if (uVar2 == 7) {
      local_10 = 5.60519e-44;
    }
    else if (uVar2 == 0x800) {
      local_10 = 4.2039e-44;
    }
    else if (uVar2 == 0x801) {
      local_10 = 4.34403e-44;
    }
    else if (uVar2 == 0x802) {
      local_10 = 4.62428e-44;
    }
    else if (uVar2 == 0x803) {
      local_10 = 4.76441e-44;
    }
    else if (uVar2 == 0x804) {
      local_10 = 4.90454e-44;
    }
    else if (uVar2 == 0x805) {
      local_10 = 5.74532e-44;
    }
    else if (uVar2 == 0x806) {
      local_10 = 5.88545e-44;
    }
    else if (uVar2 == 0x807) {
      local_10 = 6.02558e-44;
    }
    if ((*(uint *)(in_RDI + 0x24) & 2) == 0) {
      pcVar3->operands[0].field_0.simm = local_10;
      iVar4 = 1;
      if ((uVar1 & 0x8000) != 0) {
        iVar4 = 9;
      }
      pcVar3->operands[1].field_0.reg = iVar4 + (uVar1 >> 0xc & 7);
    }
    else {
      iVar4 = 1;
      if ((uVar1 & 0x8000) != 0) {
        iVar4 = 9;
      }
      pcVar3->operands[0].field_0.reg = iVar4 + (uVar1 >> 0xc & 7);
      pcVar3->operands[1].field_0.simm = local_10;
    }
  }
  return;
}

Assistant:

static void d68010_movec(m68k_info *info)
{
	uint extension;
	m68k_reg reg;
	cs_m68k* ext;
	cs_m68k_op* op0;
	cs_m68k_op* op1;


	LIMIT_CPU_TYPES(info, M68010_PLUS);

	extension = read_imm_16(info);
	reg = M68K_REG_INVALID;

	ext = build_init_op(info, M68K_INS_MOVEC, 2, 0);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	switch (extension & 0xfff) {
		case 0x000: reg = M68K_REG_SFC; break;
		case 0x001: reg = M68K_REG_DFC; break;
		case 0x800: reg = M68K_REG_USP; break;
		case 0x801: reg = M68K_REG_VBR; break;
		case 0x002: reg = M68K_REG_CACR; break;
		case 0x802: reg = M68K_REG_CAAR; break;
		case 0x803: reg = M68K_REG_MSP; break;
		case 0x804: reg = M68K_REG_ISP; break;
		case 0x003: reg = M68K_REG_TC; break;
		case 0x004: reg = M68K_REG_ITT0; break;
		case 0x005: reg = M68K_REG_ITT1; break;
		case 0x006: reg = M68K_REG_DTT0; break;
		case 0x007: reg = M68K_REG_DTT1; break;
		case 0x805: reg = M68K_REG_MMUSR; break;
		case 0x806: reg = M68K_REG_URP; break;
		case 0x807: reg = M68K_REG_SRP; break;
	}

	if (BIT_1(info->ir)) {
		op0->reg = (BIT_F(extension) ? M68K_REG_A0 : M68K_REG_D0) + ((extension >> 12) & 7);
		op1->reg = reg;
	} else {
		op0->reg = reg;
		op1->reg = (BIT_F(extension) ? M68K_REG_A0 : M68K_REG_D0) + ((extension >> 12) & 7);
	}
}